

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.cpp
# Opt level: O1

void __thiscall
pstore::index::details::internal_node::internal_node(internal_node *this,internal_node *rhs)

{
  uint uVar1;
  
  *(undefined8 *)(this->signature_)._M_elems = 0x6c616e7265746e49;
  this->bitmap_ = rhs->bitmap_;
  this->children_[0].internal_ = (internal_node *)0x0;
  uVar1 = size(rhs);
  if (uVar1 != 0) {
    memmove(this->children_,rhs->children_,(ulong)uVar1 << 3);
    return;
  }
  return;
}

Assistant:

internal_node::internal_node (internal_node const & rhs)
                    : bitmap_{rhs.bitmap_} {

                auto const * const first = std::begin (rhs.children_);
                std::copy (first, first + rhs.size (), std::begin (children_));
            }